

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

bool __thiscall cmCTestGIT::UpdateImpl(cmCTestGIT *this)

{
  cmCTest *this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  char *extraout_RDX;
  long lVar4;
  string_view value;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  allocator_type local_23b;
  allocator<char> local_23a;
  allocator_type local_239;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_submodule_sync;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200 [32];
  string local_1e0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_submodule;
  string top_dir;
  string git;
  string init_submodules;
  string local_148;
  string local_128;
  string local_108;
  string sync_recursive;
  string recursive;
  OutputLogger submodule_err;
  OutputLogger submodule_out;
  
  bVar1 = UpdateInternal(this);
  if (!bVar1) {
    return false;
  }
  FindTopDir_abi_cxx11_(&top_dir,this);
  std::__cxx11::string::string
            ((string *)&git,(string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&recursive,"--recursive",(allocator<char> *)&local_220);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sync_recursive,"--recursive",(allocator<char> *)&local_220);
  uVar2 = GetGitVersion(this);
  if (uVar2 < 0xa1d1c8) {
    std::operator+(&local_220,&top_dir,"/.gitmodules");
    bVar1 = cmsys::SystemTools::FileExists(&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    if (bVar1) {
      std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                      "Git < 1.6.5 cannot update submodules recursively\n");
    }
  }
  uVar3 = GetGitVersion(this);
  if (uVar3 < 0xa4cf68) {
    std::operator+(&local_220,&top_dir,"/.gitmodules");
    bVar1 = cmsys::SystemTools::FileExists(&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    if (bVar1) {
      std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                      "Git < 1.8.1 cannot synchronize submodules recursively\n");
    }
  }
  cmProcessTools::OutputLogger::OutputLogger
            (&submodule_out,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"submodule-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&submodule_err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"submodule-err> ");
  this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"GITInitSubmodules",(allocator<char> *)&git_submodule_sync);
  cmCTest::GetCTestConfiguration(&init_submodules,this_00,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  value._M_str = extraout_RDX;
  value._M_len = (size_t)init_submodules._M_dataplus._M_p;
  bVar1 = cmValue::IsOn((cmValue *)init_submodules._M_string_length,value);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_220,(string *)&git);
    std::__cxx11::string::string<std::allocator<char>>
              (local_200,"submodule",(allocator<char> *)&git_submodule);
    std::__cxx11::string::string<std::allocator<char>>(local_1e0,"init",&local_23a);
    __l._M_len = 3;
    __l._M_array = &local_220;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&git_submodule_sync,__l,&local_23b);
    lVar4 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&local_220._M_dataplus._M_p + lVar4));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    std::__cxx11::string::string((string *)&local_108,(string *)&top_dir);
    bVar1 = cmCTestVC::RunChild((cmCTestVC *)this,&git_submodule_sync,(OutputParser *)&submodule_out
                                ,(OutputParser *)&submodule_err,&local_108,Auto);
    std::__cxx11::string::~string((string *)&local_108);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&git_submodule_sync);
    if (!bVar1) {
      bVar1 = false;
      goto LAB_0020a934;
    }
  }
  std::__cxx11::string::string((string *)&local_220,(string *)&git);
  std::__cxx11::string::string<std::allocator<char>>
            (local_200,"submodule",(allocator<char> *)&git_submodule);
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"sync",&local_23a);
  __l_00._M_len = 3;
  __l_00._M_array = &local_220;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&git_submodule_sync,__l_00,&local_23b);
  lVar4 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_220._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  if (0xa4cf67 < uVar3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&git_submodule_sync,&sync_recursive);
  }
  std::__cxx11::string::string((string *)&local_128,(string *)&top_dir);
  bVar1 = cmCTestVC::RunChild((cmCTestVC *)this,&git_submodule_sync,(OutputParser *)&submodule_out,
                              (OutputParser *)&submodule_err,&local_128,Auto);
  std::__cxx11::string::~string((string *)&local_128);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_220,(string *)&git);
    std::__cxx11::string::string<std::allocator<char>>(local_200,"submodule",&local_23a);
    std::__cxx11::string::string<std::allocator<char>>
              (local_1e0,"update",(allocator<char> *)&local_23b);
    __l_01._M_len = 3;
    __l_01._M_array = &local_220;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&git_submodule,__l_01,&local_239);
    lVar4 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&local_220._M_dataplus._M_p + lVar4));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    if (0xa1d1c7 < uVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&git_submodule,&recursive);
    }
    std::__cxx11::string::string((string *)&local_148,(string *)&top_dir);
    bVar1 = cmCTestVC::RunChild((cmCTestVC *)this,&git_submodule,(OutputParser *)&submodule_out,
                                (OutputParser *)&submodule_err,&local_148,Auto);
    std::__cxx11::string::~string((string *)&local_148);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&git_submodule);
  }
  else {
    bVar1 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&git_submodule_sync);
LAB_0020a934:
  std::__cxx11::string::~string((string *)&init_submodules);
  cmProcessTools::LineParser::~LineParser(&submodule_err.super_LineParser);
  cmProcessTools::LineParser::~LineParser(&submodule_out.super_LineParser);
  std::__cxx11::string::~string((string *)&sync_recursive);
  std::__cxx11::string::~string((string *)&recursive);
  std::__cxx11::string::~string((string *)&git);
  std::__cxx11::string::~string((string *)&top_dir);
  return bVar1;
}

Assistant:

bool cmCTestGIT::UpdateImpl()
{
  if (!this->UpdateInternal()) {
    return false;
  }

  std::string top_dir = this->FindTopDir();
  std::string git = this->CommandLineTool;
  std::string recursive = "--recursive";
  std::string sync_recursive = "--recursive";

  // Git < 1.6.5 did not support submodule --recursive
  bool support_recursive = true;
  if (this->GetGitVersion() < cmCTestGITVersion(1, 6, 5, 0)) {
    support_recursive = false;
    // No need to require >= 1.6.5 if there are no submodules.
    if (cmSystemTools::FileExists(top_dir + "/.gitmodules")) {
      this->Log << "Git < 1.6.5 cannot update submodules recursively\n";
    }
  }

  // Git < 1.8.1 did not support sync --recursive
  bool support_sync_recursive = true;
  if (this->GetGitVersion() < cmCTestGITVersion(1, 8, 1, 0)) {
    support_sync_recursive = false;
    // No need to require >= 1.8.1 if there are no submodules.
    if (cmSystemTools::FileExists(top_dir + "/.gitmodules")) {
      this->Log << "Git < 1.8.1 cannot synchronize submodules recursively\n";
    }
  }

  OutputLogger submodule_out(this->Log, "submodule-out> ");
  OutputLogger submodule_err(this->Log, "submodule-err> ");

  bool ret;

  std::string init_submodules =
    this->CTest->GetCTestConfiguration("GITInitSubmodules");
  if (cmIsOn(init_submodules)) {
    std::vector<std::string> git_submodule_init = { git, "submodule", "init" };
    ret = this->RunChild(git_submodule_init, &submodule_out, &submodule_err,
                         top_dir);

    if (!ret) {
      return false;
    }
  }

  std::vector<std::string> git_submodule_sync = { git, "submodule", "sync" };
  if (support_sync_recursive) {
    git_submodule_sync.push_back(sync_recursive);
  }
  ret = this->RunChild(git_submodule_sync, &submodule_out, &submodule_err,
                       top_dir);

  if (!ret) {
    return false;
  }

  std::vector<std::string> git_submodule = { git, "submodule", "update" };
  if (support_recursive) {
    git_submodule.push_back(recursive);
  }
  return this->RunChild(git_submodule, &submodule_out, &submodule_err,
                        top_dir);
}